

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int read_data(spng_ctx *ctx,size_t bytes)

{
  int local_24;
  int ret;
  size_t bytes_local;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    ctx_local._4_4_ = 0x50;
  }
  else if (bytes == 0) {
    ctx_local._4_4_ = 0;
  }
  else if (((*(ushort *)&ctx->field_0xcc & 1) == 0) || (bytes < 0x2001)) {
    local_24 = (*(code *)ctx->read_fn)(ctx,ctx->stream_user_ptr,ctx->stream_buf,bytes);
    if (local_24 == 0) {
      ctx->bytes_read = bytes + ctx->bytes_read;
      if (ctx->bytes_read < bytes) {
        ctx_local._4_4_ = 3;
      }
      else {
        ctx_local._4_4_ = 0;
      }
    }
    else {
      if ((0 < local_24) || (local_24 < -2)) {
        local_24 = -2;
      }
      ctx_local._4_4_ = local_24;
    }
  }
  else {
    ctx_local._4_4_ = 0x50;
  }
  return ctx_local._4_4_;
}

Assistant:

static inline int read_data(spng_ctx *ctx, size_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;
    if(!bytes) return 0;

    if(ctx->streaming && (bytes > SPNG_READ_SIZE)) return SPNG_EINTERNAL;

    int ret = ctx->read_fn(ctx, ctx->stream_user_ptr, ctx->stream_buf, bytes);

    if(ret)
    {
        if(ret > 0 || ret < SPNG_IO_ERROR) ret = SPNG_IO_ERROR;

        return ret;
    }

    ctx->bytes_read += bytes;
    if(ctx->bytes_read < bytes) return SPNG_EOVERFLOW;

    return 0;
}